

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O3

Session * __thiscall FIX::Acceptor::getSession(Acceptor *this,string *msg,Responder *responder)

{
  Header *this_00;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  FieldBase *pFVar4;
  FieldBase *pFVar5;
  FieldBase *pFVar6;
  FieldBase *pFVar7;
  iterator iVar8;
  _Rb_tree_header *p_Var9;
  SenderCompID senderCompID;
  TargetCompID targetCompID;
  SessionID sessionID;
  Message message;
  string local_3a8;
  undefined1 local_388 [16];
  string local_378;
  _Alloc_hider local_358;
  size_type local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  field_metrics local_338;
  FieldBase local_330;
  SessionID local_2d8;
  Message local_188;
  
  Message::Message(&local_188);
  bVar2 = Message::setStringHeader(&local_188,msg);
  if (bVar2) {
    this_00 = &local_188.m_header;
    pFVar4 = FieldMap::getFieldRef(&this_00->super_FieldMap,8);
    pFVar5 = FieldMap::getFieldRef(&this_00->super_FieldMap,0x31);
    pFVar6 = FieldMap::getFieldRef(&this_00->super_FieldMap,0x38);
    pFVar7 = FieldMap::getFieldRef(&this_00->super_FieldMap,0x23);
    iVar3 = std::__cxx11::string::compare((char *)&pFVar7->m_string);
    if (iVar3 == 0) {
      local_388._0_8_ = &PTR__FieldBase_001f55c8;
      local_388._8_4_ = 0x31;
      local_378._M_dataplus._M_p = local_388 + 0x20;
      pcVar1 = (pFVar6->m_string)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_388 + 0x10),pcVar1,pcVar1 + (pFVar6->m_string)._M_string_length);
      local_358._M_p = local_388 + 0x40;
      local_350 = 0;
      local_348._M_local_buf[0] = '\0';
      local_338.m_length = 0;
      local_338.m_checksum = 0;
      local_388._0_8_ = &PTR__FieldBase_001f55e8;
      local_330._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001f55c8;
      local_330.m_tag = 0x38;
      local_330.m_string._M_dataplus._M_p = (pointer)&local_330.m_string.field_2;
      pcVar1 = (pFVar5->m_string)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_330.m_string,pcVar1,pcVar1 + (pFVar5->m_string)._M_string_length);
      local_330.m_data._M_dataplus._M_p = (pointer)&local_330.m_data.field_2;
      local_330.m_data._M_string_length = 0;
      local_330.m_data.field_2._M_local_buf[0] = '\0';
      local_330.m_metrics.m_length = 0;
      local_330.m_metrics.m_checksum = 0;
      local_330._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001f5620;
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
      SessionID::SessionID
                (&local_2d8,&pFVar4->m_string,(string *)(local_388 + 0x10),&local_330.m_string,
                 &local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      iVar8 = std::
              _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Session_*>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Session_*>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
              ::find(&(this->m_sessions)._M_t,&local_2d8);
      p_Var9 = &(this->m_sessions)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)iVar8._M_node != p_Var9) {
        Session::setResponder((Session *)iVar8._M_node[0xb]._M_left,responder);
        responder = (Responder *)iVar8._M_node[0xb]._M_left;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.m_frozenString._M_dataplus._M_p != &local_2d8.m_frozenString.field_2) {
        operator_delete(local_2d8.m_frozenString._M_dataplus._M_p,
                        local_2d8.m_frozenString.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.m_sessionQualifier._M_dataplus._M_p != &local_2d8.m_sessionQualifier.field_2)
      {
        operator_delete(local_2d8.m_sessionQualifier._M_dataplus._M_p,
                        local_2d8.m_sessionQualifier.field_2._M_allocated_capacity + 1);
      }
      FieldBase::~FieldBase((FieldBase *)&local_2d8.m_targetCompID);
      FieldBase::~FieldBase((FieldBase *)&local_2d8.m_senderCompID);
      FieldBase::~FieldBase((FieldBase *)&local_2d8);
      FieldBase::~FieldBase(&local_330);
      FieldBase::~FieldBase((FieldBase *)local_388);
      if ((_Rb_tree_header *)iVar8._M_node != p_Var9) goto LAB_00155294;
    }
  }
  responder = (Responder *)0x0;
LAB_00155294:
  Message::~Message(&local_188);
  return (Session *)responder;
}

Assistant:

Session *Acceptor::getSession(const std::string &msg, Responder &responder) {
  Message message;
  if (!message.setStringHeader(msg)) {
    return 0;
  }

  try {
    auto const &beginString = message.getHeader().getField<BeginString>();
    auto const &clSenderCompID = message.getHeader().getField<SenderCompID>();
    auto const &clTargetCompID = message.getHeader().getField<TargetCompID>();
    auto const &msgType = message.getHeader().getField<MsgType>();
    if (msgType != MsgType_Logon) {
      return 0;
    }

    SenderCompID senderCompID(clTargetCompID);
    TargetCompID targetCompID(clSenderCompID);
    SessionID sessionID(beginString, senderCompID, targetCompID);

    Sessions::iterator i = m_sessions.find(sessionID);
    if (i != m_sessions.end()) {
      i->second->setResponder(&responder);
      return i->second;
    }
  } catch (FieldNotFound &) {}
  return 0;
}